

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacBac.c
# Opt level: O1

void Bac_ManWriteBacNtk(Vec_Str_t *vOut,Bac_Ntk_t *pNtk)

{
  int *piVar1;
  size_t __size;
  int iVar2;
  char *pcVar3;
  char *pcVar4;
  long lVar5;
  long lVar6;
  int iVar7;
  size_t sVar8;
  
  pcVar4 = (pNtk->vType).pArray;
  sVar8 = (size_t)(pNtk->vType).nSize;
  lVar5 = (long)vOut->nSize + sVar8;
  if (vOut->nCap < (int)lVar5) {
    __size = lVar5 * 2;
    if (vOut->nCap < (int)__size) {
      if (vOut->pArray == (char *)0x0) {
        pcVar3 = (char *)malloc(__size);
      }
      else {
        pcVar3 = (char *)realloc(vOut->pArray,__size);
      }
      vOut->pArray = pcVar3;
      vOut->nCap = (int)__size;
    }
  }
  memcpy(vOut->pArray + vOut->nSize,pcVar4,sVar8);
  lVar5 = (long)vOut->nSize + sVar8;
  vOut->nSize = (int)lVar5;
  piVar1 = (pNtk->vFanin).pArray;
  lVar6 = (long)(pNtk->vType).nSize;
  lVar5 = lVar5 + lVar6 * 4;
  if (vOut->nCap < (int)lVar5) {
    sVar8 = lVar5 * 2;
    if (vOut->nCap < (int)sVar8) {
      if (vOut->pArray == (char *)0x0) {
        pcVar4 = (char *)malloc(sVar8);
      }
      else {
        pcVar4 = (char *)realloc(vOut->pArray,sVar8);
      }
      vOut->pArray = pcVar4;
      vOut->nCap = (int)sVar8;
    }
  }
  iVar7 = (int)(lVar6 << 2);
  memcpy(vOut->pArray + vOut->nSize,piVar1,(long)iVar7);
  iVar7 = iVar7 + vOut->nSize;
  vOut->nSize = iVar7;
  piVar1 = (pNtk->vInfo).pArray;
  iVar2 = ((pNtk->vInfo).nSize / 3) * 0xc;
  iVar7 = iVar7 + iVar2;
  if ((vOut->nCap < iVar7) && (iVar7 = iVar7 * 2, vOut->nCap < iVar7)) {
    if (vOut->pArray == (char *)0x0) {
      pcVar4 = (char *)malloc((long)iVar7);
    }
    else {
      pcVar4 = (char *)realloc(vOut->pArray,(long)iVar7);
    }
    vOut->pArray = pcVar4;
    vOut->nCap = iVar7;
  }
  memcpy(vOut->pArray + vOut->nSize,piVar1,(long)iVar2);
  vOut->nSize = vOut->nSize + iVar2;
  return;
}

Assistant:

void Bac_ManWriteBacNtk( Vec_Str_t * vOut, Bac_Ntk_t * pNtk )
{
    //char * pName; int iObj, NameId;
    Vec_StrPushBuffer( vOut, (char *)Vec_StrArray(&pNtk->vType),       Bac_NtkObjNum(pNtk) );
    Vec_StrPushBuffer( vOut, (char *)Vec_IntArray(&pNtk->vFanin),  4 * Bac_NtkObjNum(pNtk) );
    Vec_StrPushBuffer( vOut, (char *)Vec_IntArray(&pNtk->vInfo),  12 * Bac_NtkInfoNum(pNtk) );
/*
    // write input/output/box names
    Bac_NtkForEachPiMain( pNtk, iObj, i )
    {
        pName = Bac_ObjNameStr( pNtk, iObj );
        Vec_StrPrintStr( vOut, pName );
        Vec_StrPush( vOut, '\0' );
    }
    Bac_NtkForEachPoMain( pNtk, iObj, i )
    {
        pName = Bac_ObjNameStr( pNtk, iObj );
        Vec_StrPrintStr( vOut, pName );
        Vec_StrPush( vOut, '\0' );
    }
    Bac_NtkForEachBox( pNtk, iObj )
    {
        pName = Bac_ObjNameStr( pNtk, iObj );  
        Vec_StrPrintStr( vOut, pName );
        Vec_StrPush( vOut, '\0' );
    }
*/
}